

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validators.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pVVar1;
  char **argv_00;
  Option *pOVar2;
  int count;
  string file;
  App app;
  int local_61c;
  undefined1 *local_618;
  long local_610;
  undefined1 local_608 [16];
  char **local_5f8;
  _Any_data local_5f0;
  _Manager_type local_5e0;
  undefined8 uStack_5d8;
  _Any_data local_5d0;
  code *local_5c0;
  undefined8 uStack_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b0;
  undefined8 local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  undefined4 local_590;
  undefined2 local_58c;
  string local_588;
  string local_568;
  _Any_data local_548;
  _Manager_type local_538;
  undefined8 local_530;
  _Any_data local_528;
  code *local_518;
  undefined8 local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  undefined8 local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined4 local_4e8;
  undefined2 local_4e4;
  undefined1 *local_4d8;
  long local_4d0;
  undefined1 local_4c8 [16];
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  _Any_data local_3f8;
  code *local_3e8;
  _Any_data local_3d8;
  code *local_3c8;
  char *local_3b8 [2];
  char local_3a8 [21];
  undefined1 uStack_393;
  App local_390;
  
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Validator checker","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
  CLI::App::App(&local_390,&local_418,&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"-f,--file,file","");
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"File name","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_390,&local_568,&local_498,&local_458);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_3f8,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::ExistingFile);
  local_5f8 = argv;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_3d8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::ExistingFile + 0x20));
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,CLI::ExistingFile._64_8_,
             CLI::ExistingFile._72_8_ + CLI::ExistingFile._64_8_);
  register0x00000000 = CLI::ExistingFile._100_2_;
  local_3a8[0x10] = CLI::ExistingFile[0x60];
  local_3a8[0x11] = CLI::ExistingFile[0x61];
  local_3a8[0x12] = CLI::ExistingFile[0x62];
  local_3a8[0x13] = CLI::ExistingFile[99];
  local_618 = local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"");
  stack0xfffffffffffffc6c = CONCAT11(1,local_3a8[0x14]);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_3f8);
  if (local_610 != 0) {
    pVVar1 = (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_5f0._M_unused._M_object = &local_5e0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_5f0,local_618,local_618 + local_610);
    std::__cxx11::string::operator=((string *)&pVVar1[-1].name_,(string *)local_5f0._M_pod_data);
    if ((_Manager_type *)local_5f0._M_unused._0_8_ != &local_5e0) {
      operator_delete(local_5f0._M_unused._M_object);
    }
  }
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0]);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  local_61c = 0;
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"-v,--value","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Value in range","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&local_390,&local_478,&local_61c,&local_588);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  CLI::Range::Range<int>((Range *)&local_5f0,3,6,&local_4b8);
  local_548._M_unused._M_object = (_Manager_type *)0x0;
  local_548._8_8_ = 0;
  local_538 = (_Manager_type)0x0;
  local_530 = uStack_5d8;
  if (local_5e0 != (_Manager_type)0x0) {
    local_548._M_unused._M_object = local_5f0._M_unused._M_object;
    local_548._8_8_ = local_5f0._8_8_;
    local_538 = local_5e0;
    local_5e0 = (_Manager_type)0x0;
    uStack_5d8 = 0;
  }
  local_528._M_unused._M_object = (void *)0x0;
  local_528._8_8_ = 0;
  local_518 = (code *)0x0;
  local_510 = uStack_5b8;
  if (local_5c0 != (code *)0x0) {
    local_528._M_unused._M_object = local_5d0._M_unused._M_object;
    local_528._8_8_ = local_5d0._8_8_;
    local_518 = local_5c0;
    local_5c0 = (code *)0x0;
    uStack_5b8 = 0;
  }
  if (local_5b0 == &local_5a0) {
    local_4f8._8_4_ = local_5a0._8_4_;
    local_4f8._12_4_ = local_5a0._12_4_;
    local_508 = &local_4f8;
  }
  else {
    local_508 = local_5b0;
  }
  local_500 = local_5a8;
  local_5a8 = 0;
  local_5a0._M_allocated_capacity._0_4_ = local_5a0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_4e8 = local_590;
  local_4e4 = local_58c;
  local_5b0 = &local_5a0;
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  local_4e4 = CONCAT11(1,(undefined1)local_4e4);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_548);
  if (local_4d0 != 0) {
    pVVar1 = (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_618 = local_608;
    std::__cxx11::string::_M_construct<char*>((string *)&local_618,local_4d8,local_4d8 + local_4d0);
    std::__cxx11::string::operator=((string *)&pVVar1[-1].name_,(string *)&local_618);
    if (local_618 != local_608) {
      operator_delete(local_618);
    }
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508);
  }
  argv_00 = local_5f8;
  if (local_518 != (code *)0x0) {
    (*local_518)(&local_528,&local_528,__destroy_functor);
  }
  if (local_538 != (_Manager_type)0x0) {
    (*local_538)(&local_548,&local_548,__destroy_functor);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_5c0 != (code *)0x0) {
    (*local_5c0)(&local_5d0,&local_5d0,__destroy_functor);
  }
  if (local_5e0 != (_Manager_type)0x0) {
    (*local_5e0)(&local_5f0,&local_5f0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  CLI::App::parse_char_t<char>(&local_390,argc,argv_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Try printing help or failing the validator",0x2a);
  local_5f0._M_pod_data[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5f0._M_pod_data,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p);
  }
  CLI::App::~App(&local_390);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Validator checker");

    std::string file;
    app.add_option("-f,--file,file", file, "File name")->check(CLI::ExistingFile);

    int count{0};
    app.add_option("-v,--value", count, "Value in range")->check(CLI::Range(3, 6));
    CLI11_PARSE(app, argc, argv);

    std::cout << "Try printing help or failing the validator" << '\n';

    return 0;
}